

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

void __thiscall
QCss::ValueExtractor::borderValue
          (ValueExtractor *this,Declaration *decl,int *width,BorderStyle *style,QBrush *color)

{
  _Head_base<0UL,_QBrushData_*,_false> _Var1;
  QColor color_00;
  DataPtr DVar2;
  _Head_base<0UL,_QBrushData_*,_false> _Var3;
  int iVar4;
  uint uVar5;
  BorderStyle BVar6;
  DeclarationData *pDVar7;
  ulong uVar8;
  Value *v;
  ValueExtractor *this_00;
  long in_FS_OFFSET;
  LengthData LVar9;
  undefined1 local_98 [8];
  undefined1 local_90 [16];
  undefined1 *puStack_80;
  undefined1 local_78 [32];
  undefined1 local_58 [8];
  anon_union_24_3_e3d07ef4_for_data aStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (decl->d).d.ptr;
  if (3 < *(ulong *)&(pDVar7->parsed).d.field_0x18) {
    local_90._0_8_ = -NAN;
    local_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    qvariant_cast<QCss::BorderData>((BorderData *)local_90,&pDVar7->parsed);
    iVar4 = lengthValueFromData((LengthData *)local_90,&this->f);
    *width = iVar4;
    *style = (BorderStyle)puStack_80;
    if (local_78._12_4_ == Invalid) {
      local_58._0_4_ = Invalid;
      local_58._4_2_ = 0xffff;
      local_58._6_2_ = 0;
      aStack_50._0_6_ = 0;
      QBrush::QBrush((QBrush *)local_98,(QColor *)local_58,SolidPattern);
    }
    else {
      brushFromData((BrushData *)local_98,(QPalette *)local_78);
    }
    _Var1._M_head_impl =
         (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (QBrushData *)local_98;
    local_98 = (undefined1  [8])_Var1._M_head_impl;
    QBrush::~QBrush((QBrush *)local_98);
    goto LAB_00540060;
  }
  *width = 0;
  *style = BorderStyle_None;
  local_78._16_4_ = 0;
  local_78._20_2_ = 0xffff;
  local_78._22_8_ = 0;
  color_00._14_2_ = local_78._30_2_;
  color_00.cspec = SUB144(ZEXT614(0xffff00000000),0);
  color_00.ct = (CT)SUB1410(ZEXT614(0xffff00000000),4);
  QBrush::operator=(color,color_00);
  if ((((decl->d).d.ptr)->values).d.size == 0) goto LAB_00540068;
  local_90._0_8_ = -NAN;
  local_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (ValueExtractor *)local_78;
  BrushData::BrushData((BrushData *)local_78);
  local_90._0_8_ = 0.0;
  local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
  puStack_80 = (undefined1 *)CONCAT44(puStack_80._4_4_,1);
  v = (((decl->d).d.ptr)->values).d.ptr;
  if ((v->type | Percentage) == Length) {
    LVar9 = lengthValue(this_00,v);
    local_90._0_8_ = LVar9.number;
    local_90._8_4_ = LVar9.unit;
    iVar4 = lengthValueFromData((LengthData *)local_90,&this->f);
    *width = iVar4;
    pDVar7 = (decl->d).d.ptr;
    if (1 < (ulong)(pDVar7->values).d.size) {
      v = (pDVar7->values).d.ptr;
      uVar5 = 1;
      goto LAB_0053ff97;
    }
LAB_00540037:
    ::QVariant::fromValue<QCss::BorderData>
              ((enable_if_t<std::is_copy_constructible_v<QCss::BorderData>_&&_std::is_destructible_v<QCss::BorderData>,_QVariant>
                *)local_58,(BorderData *)local_90);
    ::QVariant::operator=
              (&((decl->d).d.ptr)->parsed,
               (enable_if_t<std::is_copy_constructible_v<QCss::BorderData>_&&_std::is_destructible_v<QCss::BorderData>,_QVariant>
                *)local_58);
    ::QVariant::~QVariant
              ((enable_if_t<std::is_copy_constructible_v<QCss::BorderData>_&&_std::is_destructible_v<QCss::BorderData>,_QVariant>
                *)local_58);
  }
  else {
    uVar5 = 0;
LAB_0053ff97:
    uVar8 = (ulong)uVar5;
    BVar6 = parseStyleValue(v + uVar8);
    puStack_80 = (undefined1 *)CONCAT44(puStack_80._4_4_,BVar6);
    if (BVar6 == BorderStyle_Unknown) {
      puStack_80 = (undefined1 *)CONCAT44(puStack_80._4_4_,1);
      pDVar7 = (decl->d).d.ptr;
    }
    else {
      *style = BVar6;
      uVar8 = (ulong)(uVar5 + 1);
      pDVar7 = (decl->d).d.ptr;
      if ((ulong)(pDVar7->values).d.size <= uVar8) goto LAB_00540037;
    }
    parseBrushValue((Value *)local_58,(QPalette *)((pDVar7->values).d.ptr + uVar8));
    DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._4_2_ = local_58._4_2_;
    DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._0_4_ = local_58._0_4_;
    DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl._6_2_ = local_58._6_2_;
    local_78._8_8_ = CONCAT26(aStack_50._6_2_,aStack_50._0_6_);
    local_58._0_4_ = (undefined4)local_78._0_8_;
    local_58._4_2_ = SUB82(local_78._0_8_,4);
    local_58._6_2_ = SUB82(local_78._0_8_,6);
    local_78._0_8_ =
         DVar2._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
         super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
    QBrush::~QBrush((QBrush *)local_58);
    if (local_78._12_4_ != Invalid) {
      brushFromData((BrushData *)local_58,(QPalette *)local_78);
      _Var1._M_head_impl =
           (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      _Var3._M_head_impl._4_2_ = local_58._4_2_;
      _Var3._M_head_impl._0_4_ = local_58._0_4_;
      _Var3._M_head_impl._6_2_ = local_58._6_2_;
      (color->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = _Var3._M_head_impl;
      local_58._0_4_ = SUB84(_Var1._M_head_impl,0);
      local_58._4_2_ = (undefined2)((ulong)_Var1._M_head_impl >> 0x20);
      local_58._6_2_ = (undefined2)((ulong)_Var1._M_head_impl >> 0x30);
      QBrush::~QBrush((QBrush *)local_58);
      if (local_78._12_4_ != DependsOnThePalette) goto LAB_00540037;
    }
  }
LAB_00540060:
  QBrush::~QBrush((QBrush *)local_78);
LAB_00540068:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValueExtractor::borderValue(const Declaration &decl, int *width, QCss::BorderStyle *style, QBrush *color)
{
    if (decl.d->parsed.isValid()) {
        BorderData data = qvariant_cast<BorderData>(decl.d->parsed);
        *width = lengthValueFromData(data.width, f);
        *style = data.style;
        *color = data.color.type != BrushData::Invalid ? brushFromData(data.color, pal) : QBrush(QColor());
        return;
    }

    *width = 0;
    *style = BorderStyle_None;
    *color = QColor();

    if (decl.d->values.isEmpty())
        return;

    BorderData data;
    data.width.number = 0;
    data.width.unit = LengthData::None;
    data.style = BorderStyle_None;

    int i = 0;
    if (decl.d->values.at(i).type == Value::Length || decl.d->values.at(i).type == Value::Number) {
        data.width = lengthValue(decl.d->values.at(i));
        *width = lengthValueFromData(data.width, f);
        if (++i >= decl.d->values.size()) {
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
            return;
        }
    }

    data.style = parseStyleValue(decl.d->values.at(i));
    if (data.style != BorderStyle_Unknown) {
        *style = data.style;
        if (++i >= decl.d->values.size()) {
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
            return;
        }
    } else {
        data.style = BorderStyle_None;
    }

     data.color = parseBrushValue(decl.d->values.at(i), pal);
    if (data.color.type != BrushData::Invalid) {
        *color = brushFromData(data.color, pal);
        if (data.color.type != BrushData::DependsOnThePalette)
            decl.d->parsed = QVariant::fromValue<BorderData>(data);
    }
}